

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::getp_sclist
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_5,
          vm_obj_id_t *param_6)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_obj_id_t obj_00;
  vm_val_t *in_RDX;
  undefined4 in_ESI;
  CVmRun *in_RDI;
  vm_val_t ele_val;
  size_t i;
  CVmObjList *lstp;
  vm_obj_id_t lst_obj;
  size_t sc_cnt;
  undefined4 in_stack_ffffffffffffff78;
  vm_obj_id_t in_stack_ffffffffffffff7c;
  vm_val_t *in_stack_ffffffffffffff88;
  ulong local_58;
  
  if ((getp_sclist(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0')
     && (iVar1 = __cxa_guard_acquire(&getp_sclist(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                      ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_sclist::desc,0);
    __cxa_guard_release(&getp_sclist(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar1 = get_prop_check_argc(in_stack_ffffffffffffff88,(uint *)in_RDI,
                              (CVmNativeCodeDesc *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar1 == 0) {
    CVmRun::push_obj(in_RDI,in_stack_ffffffffffffff7c);
    iVar1 = (**(code **)((in_RDI->super_CVmStack).arr_ + 4))(in_RDI,in_ESI);
    obj = CVmObjList::create((int)((ulong)in_RDI >> 0x20),
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    vm_objp(0);
    for (local_58 = 0; local_58 < (ulong)(long)iVar1; local_58 = local_58 + 1) {
      obj_00 = (*(in_RDI->super_CVmStack).arr_[4].val)(in_RDI,in_ESI,local_58 & 0xffffffff);
      vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffff88,obj_00);
      CVmObjList::cons_set_element
                ((CVmObjList *)in_RDI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (vm_val_t *)0x374021);
    }
    CVmStack::discard();
    vm_val_t::set_obj(in_RDX,obj);
  }
  return 1;
}

Assistant:

int CVmObject::getp_sclist(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc,
                           vm_prop_id_t, vm_obj_id_t *)
{
    size_t sc_cnt;
    vm_obj_id_t lst_obj;
    CVmObjList *lstp;
    size_t i;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for GC protection */
    G_interpreter->push_obj(vmg_ self);

    /* get the number of superclasses */
    sc_cnt = get_superclass_count(vmg_ self);

    /* allocate a list for the results */
    lst_obj = CVmObjList::create(vmg_ FALSE, sc_cnt);
    lstp = (CVmObjList *)vm_objp(vmg_ lst_obj);

    /* build the superclass list */
    for (i = 0 ; i < sc_cnt ; ++i)
    {
        vm_val_t ele_val;

        /* get this superclass */
        ele_val.set_obj(get_superclass(vmg_ self, i));

        /* set the list element */
        lstp->cons_set_element(i, &ele_val);
    }

    /* discard our GC protection */
    G_stk->discard();

    /* return the list */
    retval->set_obj(lst_obj);

    /* handled */
    return TRUE;
}